

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

Blob<224> * bitreverse<Blob<224>>(Blob<224> *n,size_t b)

{
  uint8_t k;
  int iVar1;
  ulong in_RDX;
  Blob<224> *in_RSI;
  Blob<224> *in_RDI;
  size_t i;
  Blob<224> *rv;
  int c;
  Blob<224> *this;
  undefined8 local_20;
  
  this = in_RDI;
  Blob<224>::Blob(in_RDI,0);
  for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 8) {
    c = (int)((ulong)in_RSI >> 0x20);
    Blob<224>::operator<<=(this,c);
    iVar1 = Blob<224>::operator&(in_RSI,0xff);
    k = bitrev((uint8_t)iVar1);
    Blob<224>::operator|=(this,k);
    Blob<224>::operator>>=(this,c);
  }
  return in_RDI;
}

Assistant:

hashtype bitreverse(hashtype n, size_t b = sizeof(hashtype) * 8)
{
    assert(b <= std::numeric_limits<hashtype>::digits);
    hashtype rv = 0;
    for (size_t i = 0; i < b; i += 8) {
        rv <<= 8;
        rv |= bitrev(n & 0xff); // ensure overloaded |= op for Blob not underflowing
        n >>= 8;
    }
    return rv;
}